

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void common_init(void)

{
  common_log *log;
  
  llama_log_set(common_init::anon_class_1_0_00000001::__invoke,0);
  if (-1 < common_log_verbosity_thold) {
    log = common_log_main();
    common_log_add(log,GGML_LOG_LEVEL_INFO,"build: %d (%s) with %s for %s%s\n",
                   (ulong)(uint)LLAMA_BUILD_NUMBER,LLAMA_COMMIT,LLAMA_COMPILER,LLAMA_BUILD_TARGET,""
                  );
  }
  return;
}

Assistant:

void common_init() {
    llama_log_set([](ggml_log_level level, const char * text, void * /*user_data*/) {
        if (LOG_DEFAULT_LLAMA <= common_log_verbosity_thold) {
            common_log_add(common_log_main(), level, "%s", text);
        }
    }, NULL);

#ifdef NDEBUG
    const char * build_type = "";
#else
    const char * build_type = " (debug)";
#endif

    LOG_INF("build: %d (%s) with %s for %s%s\n", LLAMA_BUILD_NUMBER, LLAMA_COMMIT, LLAMA_COMPILER, LLAMA_BUILD_TARGET, build_type);
}